

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IR.cpp
# Opt level: O0

char * __thiscall IR::Instr::GetBailOutKindName(Instr *this)

{
  bool bVar1;
  BailOutKind BVar2;
  char *pcVar3;
  BailOutKind local_14;
  Instr *pIStack_10;
  BailOutKind kind;
  Instr *this_local;
  
  local_14 = BailOutInvalid;
  pIStack_10 = this;
  bVar1 = HasBailOutInfo(this);
  if (bVar1) {
    BVar2 = GetBailOutKind(this);
    operator|=(&local_14,BVar2);
  }
  bVar1 = HasAuxBailOut(this);
  if (bVar1) {
    BVar2 = GetAuxBailOutKind(this);
    operator|=(&local_14,BVar2);
  }
  pcVar3 = ::GetBailOutKindName(local_14);
  return pcVar3;
}

Assistant:

const char *
Instr::GetBailOutKindName() const
{
    IR::BailOutKind kind = (IR::BailOutKind)0;
    if (this->HasBailOutInfo())
    {
        kind |= this->GetBailOutKind();
    }
    if (this->HasAuxBailOut())
    {
        kind |= this->GetAuxBailOutKind();
    }

    return ::GetBailOutKindName(kind);
}